

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

ScriptFunctionType * __thiscall
Js::FunctionProxy::GetCrossSiteUndeferredFunctionType(FunctionProxy *this)

{
  BOOL BVar1;
  ParseableFunctionInfo *pPVar2;
  ScriptFunctionType *pSVar3;
  
  BVar1 = HasParseableInfo(this);
  if (BVar1 == 0) {
    pSVar3 = (ScriptFunctionType *)0x0;
  }
  else {
    pPVar2 = GetParseableFunctionInfo(this);
    pSVar3 = (pPVar2->crossSiteUndeferredFunctionType).ptr;
  }
  return pSVar3;
}

Assistant:

ScriptFunctionType * FunctionProxy::GetCrossSiteUndeferredFunctionType() const
    {
        return HasParseableInfo() ? GetParseableFunctionInfo()->GetCrossSiteUndeferredFunctionType() : nullptr;
    }